

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O3

size_t __thiscall
libchars::commands::render(commands *this,size_t buf_idx,size_t limit,string *sequence)

{
  ulong uVar1;
  pointer pcVar2;
  token *ptVar3;
  string *psVar4;
  ulong uVar5;
  size_t *psVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  bool bVar10;
  long *local_58 [2];
  long local_48 [2];
  string *local_38;
  
  parse(this);
  uVar1 = (this->super_edit_object).buflen;
  if (limit == 0 || uVar1 <= buf_idx) {
    sVar7 = 0;
  }
  else {
    psVar6 = &(this->characters).
              super__Vector_base<libchars::command_char,_std::allocator<libchars::command_char>_>.
              _M_impl.super__Vector_impl_data._M_start[buf_idx].render_length;
    lVar8 = 0;
    uVar5 = buf_idx + 1;
    sVar7 = 0;
    do {
      uVar9 = psVar6[-3] + sVar7;
      if ((limit < uVar9) || (lVar8 = lVar8 + *psVar6, sVar7 = uVar9, limit <= uVar9)) break;
      psVar6 = psVar6 + 7;
      bVar10 = uVar5 < uVar1;
      uVar5 = uVar5 + 1;
    } while (bVar10);
    if (lVar8 != 0) {
      pcVar2 = (this->characters).
               super__Vector_base<libchars::command_char,_std::allocator<libchars::command_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      ptVar3 = pcVar2[buf_idx].T;
      local_38 = sequence;
      if ((ptVar3 != (token *)0x0) && (ptVar3->offset < buf_idx)) {
        color_str(this,pcVar2[buf_idx].color);
        std::__cxx11::string::append((char *)local_38);
      }
      std::__cxx11::string::substr((ulong)local_58,(ulong)&this->rendered_str);
      psVar4 = local_38;
      std::__cxx11::string::operator=((string *)local_38,(string *)local_58);
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      std::__cxx11::string::append((char *)psVar4);
      return sVar7;
    }
  }
  sequence->_M_string_length = 0;
  *(sequence->_M_dataplus)._M_p = '\0';
  return sVar7;
}

Assistant:

size_t commands::render(size_t buf_idx, size_t limit, std::string &sequence)
    {
        parse();

        size_t idx = buf_idx, displayed = 0, r_offset = 0, r_length = 0;
        while (idx < length() && displayed < limit) {
            command_char &C = characters[idx++];
            if ((displayed + C.display_length) > limit)
                break;
            if (r_length == 0) {
                r_offset = C.render_offset;
                r_length = C.render_length;
            }
            else {
                r_length += C.render_length;
            }
            displayed += C.display_length;
        }

        if (r_length > 0) {
            // add token color if render has to start in the middle of a token
            command_char &C = characters[buf_idx];
            if (C.T != NULL && buf_idx > C.T->offset)
                sequence.append(color_str(C.color));
            sequence = rendered_str.substr(r_offset, r_length);
            sequence.append(color_str(COLOR_NORMAL)); // just in case the rest of the terminal gets messed up
        }
        else {
            sequence.clear();
        }

        return displayed;
    }